

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_xz.c
# Opt level: O0

void set_error(archive_read *a,int ret)

{
  undefined4 in_ESI;
  archive *in_RDI;
  
  switch(in_ESI) {
  case 0:
  case 1:
    break;
  default:
    archive_set_error(in_RDI,-1,"Lzma decompression failed:  Unknown error");
    break;
  case 5:
    archive_set_error(in_RDI,0xc,"Lzma library error: Cannot allocate memory");
    break;
  case 6:
    archive_set_error(in_RDI,0xc,"Lzma library error: Out of memory");
    break;
  case 7:
    archive_set_error(in_RDI,-1,"Lzma library error: format not recognized");
    break;
  case 8:
    archive_set_error(in_RDI,-1,"Lzma library error: Invalid options");
    break;
  case 9:
    archive_set_error(in_RDI,-1,"Lzma library error: Corrupted input data");
    break;
  case 10:
    archive_set_error(in_RDI,-1,"Lzma library error:  No progress is possible");
  }
  return;
}

Assistant:

static void
set_error(struct archive_read_filter *self, int ret)
{

	switch (ret) {
	case LZMA_STREAM_END: /* Found end of stream. */
	case LZMA_OK: /* Decompressor made some progress. */
		break;
	case LZMA_MEM_ERROR:
		archive_set_error(&self->archive->archive, ENOMEM,
		    "Lzma library error: Cannot allocate memory");
		break;
	case LZMA_MEMLIMIT_ERROR:
		archive_set_error(&self->archive->archive, ENOMEM,
		    "Lzma library error: Out of memory");
		break;
	case LZMA_FORMAT_ERROR:
		archive_set_error(&self->archive->archive,
		    ARCHIVE_ERRNO_MISC,
		    "Lzma library error: format not recognized");
		break;
	case LZMA_OPTIONS_ERROR:
		archive_set_error(&self->archive->archive,
		    ARCHIVE_ERRNO_MISC,
		    "Lzma library error: Invalid options");
		break;
	case LZMA_DATA_ERROR:
		archive_set_error(&self->archive->archive,
		    ARCHIVE_ERRNO_MISC,
		    "Lzma library error: Corrupted input data");
		break;
	case LZMA_BUF_ERROR:
		archive_set_error(&self->archive->archive,
		    ARCHIVE_ERRNO_MISC,
		    "Lzma library error:  No progress is possible");
		break;
	default:
		/* Return an error. */
		archive_set_error(&self->archive->archive,
		    ARCHIVE_ERRNO_MISC,
		    "Lzma decompression failed:  Unknown error");
		break;
	}
}